

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_file.c
# Opt level: O0

err_t cmdFileDrop(char *name,size_t count)

{
  bool_t bVar1;
  file_t pFVar2;
  file_t in_RSI;
  size_t size;
  file_t file;
  err_t code;
  char *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  undefined4 local_1c;
  undefined4 local_4;
  
  pFVar2 = fileOpen(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  local_1c = 0xcb;
  if (pFVar2 != (file_t)0x0) {
    local_1c = 0;
  }
  local_4 = local_1c;
  if (local_1c == 0) {
    pFVar2 = (file_t)fileSize(pFVar2);
    if (pFVar2 == (file_t)0xffffffffffffffff) {
      local_1c = 0xcf;
    }
    else if (pFVar2 < in_RSI) {
      local_1c = 0xd1;
    }
    if (local_1c == 0) {
      bVar1 = fileTrunc(pFVar2,(size_t)in_stack_ffffffffffffffc8);
      if (bVar1 == 0) {
        local_1c = 0xce;
      }
      if (local_1c == 0) {
        bVar1 = fileClose((file_t)0x105873);
        local_4 = 0x67;
        if (bVar1 != 0) {
          local_4 = 0;
        }
      }
      else {
        fileClose((file_t)0x10585f);
        local_4 = local_1c;
      }
    }
    else {
      fileClose((file_t)0x105823);
      local_4 = local_1c;
    }
  }
  return local_4;
}

Assistant:

err_t cmdFileDrop(const char* name, size_t count)
{
	err_t code;
	file_t file;
	size_t size;
	// pre
	ASSERT(strIsValid(name));
	// открыть файл
	code = cmdFileOpen(file, name, "r+b");
	ERR_CALL_CHECK(code);
	// определить размер файла
	if ((size = fileSize(file)) == SIZE_MAX)
		code = ERR_FILE_READ;
	else if (size < count)
		code = ERR_FILE_SIZE;
	ERR_CALL_HANDLE(code, cmdFileClose(file));
	// обрезать файл
	if (!fileTrunc(file, size - count))
		code = ERR_FILE_WRITE;
	ERR_CALL_HANDLE(code, cmdFileClose(file));
	// завершить
	return cmdFileClose(file);
}